

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_tcache_fill_small
               (tsdn_t *tsdn,arena_t *arena,tcache_t *tcache,cache_bin_t *tbin,szind_t binind,
               uint64_t prof_accumbytes)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  bin_t *pbVar4;
  ticker_t *ptVar5;
  bin_info_t *in_RCX;
  extent_t *in_RDX;
  arena_t *in_RDI;
  uint in_R8D;
  void **in_R9;
  void *ptr_1;
  uint j;
  void *ptr;
  uint tofill;
  extent_t *slab;
  bin_t *bin;
  uint binshard;
  uint cnt;
  uint nfill;
  uint i;
  ticker_t *decay_ticker;
  tsd_t *tsd;
  bin_info_t *in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  arena_t *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  bin_t *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  extent_t *extent;
  uint local_84;
  uint local_7c;
  
  pbVar4 = arena_bin_choose_lock
                     ((tsdn_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                      (uint *)in_stack_ffffffffffffff38);
  local_7c = 0;
  uVar2 = tcache_bin_info[in_R8D].ncached_max >>
          (*(byte *)((long)&in_RDX[7].field_5 + (ulong)in_R8D + 4) & 0x1f);
  do {
    if (uVar2 <= local_7c) {
LAB_001145ae:
      (pbVar4->stats).nmalloc = (ulong)local_7c + (pbVar4->stats).nmalloc;
      (pbVar4->stats).nrequests = in_RCX->slab_size + (pbVar4->stats).nrequests;
      (pbVar4->stats).curregs = (ulong)local_7c + (pbVar4->stats).curregs;
      (pbVar4->stats).nfills = (pbVar4->stats).nfills + 1;
      in_RCX->slab_size = 0;
      malloc_mutex_unlock((tsdn_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (malloc_mutex_t *)in_stack_ffffffffffffff48);
      *(uint *)((long)&in_RCX->reg_size + 4) = local_7c;
      malloc_mutex_assert_not_owner((tsdn_t *)in_stack_ffffffffffffff38,(malloc_mutex_t *)0x114671);
      malloc_mutex_assert_not_owner((tsdn_t *)in_stack_ffffffffffffff38,(malloc_mutex_t *)0x11468d);
      if (in_RDI != (arena_t *)0x0) {
        arena_ind_get((arena_t *)0x114718);
        ptVar5 = decay_ticker_get((tsd_t *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
        if ((ptVar5 != (ticker_t *)0x0) && (_Var1 = ticker_ticks((ticker_t *)in_RDI,0), _Var1)) {
          arena_decay((tsdn_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_RDI
                      ,false,false);
        }
      }
      return;
    }
    extent = pbVar4->slabcur;
    if ((extent == (extent_t *)0x0) || (uVar3 = extent_nfree_get(extent), uVar3 == 0)) {
      local_84 = 1;
      in_stack_ffffffffffffff58 =
           (bin_t *)arena_bin_malloc_hard
                              ((tsdn_t *)extent,
                               (arena_t *)
                               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                               in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                               in_stack_ffffffffffffff50);
      if (in_stack_ffffffffffffff58 == (bin_t *)0x0) {
        if (local_7c != 0) {
          memmove((void *)(*(long *)&in_RCX->nregs + (ulong)local_7c * -8),
                  (void *)(*(long *)&in_RCX->nregs + (ulong)uVar2 * -8),(ulong)local_7c << 3);
        }
        goto LAB_001145ae;
      }
      *(bin_t **)(*(long *)&in_RCX->nregs + (ulong)uVar2 * -8 + (ulong)local_7c * 8) =
           in_stack_ffffffffffffff58;
    }
    else {
      in_stack_ffffffffffffff44 = uVar2 - local_7c;
      local_84 = in_stack_ffffffffffffff44;
      uVar3 = extent_nfree_get(extent);
      in_stack_ffffffffffffff64 = local_84;
      if (uVar3 <= in_stack_ffffffffffffff44) {
        local_84 = extent_nfree_get(extent);
      }
      in_stack_ffffffffffffff40 = local_84;
      arena_slab_reg_alloc_batch(in_RDX,in_RCX,in_R8D,in_R9);
    }
    if ((opt_junk_alloc & 1U) != 0) {
      for (in_stack_ffffffffffffff54 = 0; in_stack_ffffffffffffff54 < local_84;
          in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 + 1) {
        in_stack_ffffffffffffff48 =
             *(arena_t **)
              (*(long *)&in_RCX->nregs + (ulong)uVar2 * -8 + (ulong)local_7c * 8 +
              (ulong)in_stack_ffffffffffffff54 * 8);
        arena_alloc_junk_small
                  ((void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38,false);
      }
    }
    local_7c = local_84 + local_7c;
  } while( true );
}

Assistant:

void
arena_tcache_fill_small(tsdn_t *tsdn, arena_t *arena, tcache_t *tcache,
    cache_bin_t *tbin, szind_t binind, uint64_t prof_accumbytes) {
	unsigned i, nfill, cnt;

	assert(tbin->ncached == 0);

	if (config_prof && arena_prof_accum(tsdn, arena, prof_accumbytes)) {
		prof_idump(tsdn);
	}

	unsigned binshard;
	bin_t *bin = arena_bin_choose_lock(tsdn, arena, binind, &binshard);

	for (i = 0, nfill = (tcache_bin_info[binind].ncached_max >>
	    tcache->lg_fill_div[binind]); i < nfill; i += cnt) {
		extent_t *slab;
		if ((slab = bin->slabcur) != NULL && extent_nfree_get(slab) >
		    0) {
			unsigned tofill = nfill - i;
			cnt = tofill < extent_nfree_get(slab) ?
				tofill : extent_nfree_get(slab);
			arena_slab_reg_alloc_batch(
			   slab, &bin_infos[binind], cnt,
			   tbin->avail - nfill + i);
		} else {
			cnt = 1;
			void *ptr = arena_bin_malloc_hard(tsdn, arena, bin,
			    binind, binshard);
			/*
			 * OOM.  tbin->avail isn't yet filled down to its first
			 * element, so the successful allocations (if any) must
			 * be moved just before tbin->avail before bailing out.
			 */
			if (ptr == NULL) {
				if (i > 0) {
					memmove(tbin->avail - i,
						tbin->avail - nfill,
						i * sizeof(void *));
				}
				break;
			}
			/* Insert such that low regions get used first. */
			*(tbin->avail - nfill + i) = ptr;
		}
		if (config_fill && unlikely(opt_junk_alloc)) {
			for (unsigned j = 0; j < cnt; j++) {
				void* ptr = *(tbin->avail - nfill + i + j);
				arena_alloc_junk_small(ptr, &bin_infos[binind],
							true);
			}
		}
	}
	if (config_stats) {
		bin->stats.nmalloc += i;
		bin->stats.nrequests += tbin->tstats.nrequests;
		bin->stats.curregs += i;
		bin->stats.nfills++;
		tbin->tstats.nrequests = 0;
	}
	malloc_mutex_unlock(tsdn, &bin->lock);
	tbin->ncached = i;
	arena_decay_tick(tsdn, arena);
}